

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O3

Bbl_Obj_t * Bbl_ObjFaninNext(Bbl_Obj_t *p,Bbl_Obj_t *pPrev)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = *(uint *)&p->field_0x8 >> 4;
  uVar2 = 0;
  if (0xf < *(uint *)&p->field_0x8) {
    uVar2 = 0;
    while ((Bbl_Obj_t *)((long)p - (long)(&p[1].Id)[uVar2]) != pPrev) {
      uVar2 = uVar2 + 1;
      if (uVar1 == uVar2) {
        return (Bbl_Obj_t *)0x0;
      }
    }
  }
  if ((int)uVar2 < (int)(uVar1 - 1)) {
    return (Bbl_Obj_t *)((long)p - (long)(&p[1].Fnc)[uVar2 & 0xffffffff]);
  }
  return (Bbl_Obj_t *)0x0;
}

Assistant:

Bbl_Obj_t * Bbl_ObjFaninNext( Bbl_Obj_t * p, Bbl_Obj_t * pPrev )
{
    Bbl_Obj_t * pFanin;
    int i;
    Bbl_ObjForEachFanin_int( p, pFanin, i )
        if ( pFanin == pPrev )
            break;
    return i < Bbl_ObjFaninNum(p) - 1 ? Bbl_ObjFanin( p, i+1 ) : NULL;
}